

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_auth_cancel_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  smtpstate local_50;
  smtpstate local_4c;
  smtpstate state2;
  smtpstate state1;
  size_t len;
  char *initresp;
  char *mech;
  smtp_conn *smtpc;
  SessionHandle *data;
  smtpstate local_18;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  smtpc = (smtp_conn *)conn->data;
  mech = (char *)&conn->proto;
  initresp = (char *)0x0;
  len = 0;
  _state2 = 0;
  local_4c = SMTP_STOP;
  local_50 = SMTP_STOP;
  (conn->proto).imapc.prefmech = (conn->proto).pop3c.authtypes ^ (conn->proto).imapc.prefmech;
  local_18 = instate;
  result = smtpcode;
  _instate_local = conn;
  data._4_4_ = smtp_calc_sasl_details
                         (conn,&initresp,(char **)&len,(size_t *)&state2,&local_4c,&local_50);
  if (data._4_4_ == CURLE_OK) {
    if (initresp == (char *)0x0) {
      Curl_failf((SessionHandle *)smtpc,"Authentication cancelled");
      data._4_4_ = CURLE_LOGIN_DENIED;
    }
    else {
      data._4_4_ = smtp_perform_auth(_instate_local,initresp,(char *)len,_state2,local_4c,local_50);
      if (len != 0) {
        (*Curl_cfree)((void *)len);
      }
    }
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_auth_cancel_resp(struct connectdata *conn,
                                            int smtpcode,
                                            smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  const char *mech = NULL;
  char *initresp = NULL;
  size_t len = 0;
  smtpstate state1 = SMTP_STOP;
  smtpstate state2 = SMTP_STOP;

  (void)smtpcode;
  (void)instate; /* no use for this yet */

  /* Remove the offending mechanism from the supported list */
  smtpc->authmechs ^= smtpc->authused;

  /* Calculate alternative SASL login details */
  result = smtp_calc_sasl_details(conn, &mech, &initresp, &len, &state1,
                                  &state2);

  if(!result) {
    /* Do we have any mechanisms left? */
    if(mech) {
      /* Retry SASL based authentication */
      result = smtp_perform_auth(conn, mech, initresp, len, state1, state2);

      Curl_safefree(initresp);
    }
    else {
      failf(data, "Authentication cancelled");

      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}